

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeCommandListGetOrdinal(ze_command_list_handle_t hCommandList,uint32_t *pOrdinal)

{
  ze_pfnCommandListGetOrdinal_t pfnGetOrdinal;
  dditable_t *dditable;
  ze_result_t result;
  uint32_t *pOrdinal_local;
  ze_command_list_handle_t hCommandList_local;
  
  if (*(code **)(*(long *)(hCommandList + 8) + 0x308) == (code *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hCommandList_local._4_4_ =
         (**(code **)(*(long *)(hCommandList + 8) + 0x308))(*(undefined8 *)hCommandList,pOrdinal);
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListGetOrdinal(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t* pOrdinal                              ///< [out] command queue group ordinal to which command list is submitted
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnGetOrdinal = dditable->ze.CommandList.pfnGetOrdinal;
        if( nullptr == pfnGetOrdinal )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // forward to device-driver
        result = pfnGetOrdinal( hCommandList, pOrdinal );

        return result;
    }